

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Call.h
# Opt level: O0

ptr<Value> __thiscall Call::evaluate(Call *this,Environment *env)

{
  bool bVar1;
  element_type *peVar2;
  ThrowPacket *this_00;
  size_type *this_01;
  element_type *peVar3;
  undefined8 in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Value> pVar4;
  value_type local_d0;
  __shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_c0;
  shared_ptr<Expression> *expr;
  iterator __end1;
  iterator __begin1;
  ExpressionList *__range1;
  ValueList values;
  allocator<char> local_71;
  string local_70;
  ptr<Value> local_50;
  undefined1 local_40 [8];
  ptr<Callable> callable;
  ptr<Value> value;
  Environment *env_local;
  Call *this_local;
  
  peVar2 = std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &(env->symbols)._M_h._M_bucket_count);
  (**peVar2->_vptr_Expression)
            (&callable.super___shared_ptr<Callable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,peVar2,
             in_RDX);
  std::dynamic_pointer_cast<Callable,Value>((shared_ptr<Value> *)local_40);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40);
  if (!bVar1) {
    values.super__Vector_base<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
    this_00 = (ThrowPacket *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Value not callable",&local_71);
    ExceptionObjects::call_failed((ExceptionObjects *)&local_50,&local_70);
    ThrowPacket::ThrowPacket(this_00,&local_50);
    values.super__Vector_base<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    __cxa_throw(this_00,&ThrowPacket::typeinfo,ThrowPacket::~ThrowPacket);
  }
  std::vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>::vector
            ((vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_> *)&__range1);
  this_01 = &(env->symbols)._M_h._M_element_count;
  __end1 = std::vector<std::shared_ptr<Expression>,_std::allocator<std::shared_ptr<Expression>_>_>::
           begin((vector<std::shared_ptr<Expression>,_std::allocator<std::shared_ptr<Expression>_>_>
                  *)this_01);
  expr = (shared_ptr<Expression> *)
         std::vector<std::shared_ptr<Expression>,_std::allocator<std::shared_ptr<Expression>_>_>::
         end((vector<std::shared_ptr<Expression>,_std::allocator<std::shared_ptr<Expression>_>_> *)
             this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<Expression>_*,_std::vector<std::shared_ptr<Expression>,_std::allocator<std::shared_ptr<Expression>_>_>_>
                                *)&expr);
    if (!bVar1) break;
    local_c0 = (__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               __gnu_cxx::
               __normal_iterator<std::shared_ptr<Expression>_*,_std::vector<std::shared_ptr<Expression>,_std::allocator<std::shared_ptr<Expression>_>_>_>
               ::operator*(&__end1);
    peVar2 = std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_c0);
    (**peVar2->_vptr_Expression)(&local_d0,peVar2,in_RDX);
    std::vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>::push_back
              ((vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_> *)&__range1
               ,&local_d0);
    std::shared_ptr<Value>::~shared_ptr(&local_d0);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Expression>_*,_std::vector<std::shared_ptr<Expression>,_std::allocator<std::shared_ptr<Expression>_>_>_>
    ::operator++(&__end1);
  }
  peVar3 = std::__shared_ptr_access<Callable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Callable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_40);
  (*peVar3->_vptr_Callable[1])(this,peVar3,&__range1);
  std::vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>::~vector
            ((vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_> *)&__range1);
  std::shared_ptr<Callable>::~shared_ptr((shared_ptr<Callable> *)local_40);
  std::shared_ptr<Value>::~shared_ptr
            ((shared_ptr<Value> *)
             &callable.super___shared_ptr<Callable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pVar4.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  pVar4.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Value>)pVar4.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> evaluate(Environment *env) override {
        ptr<Value> value = expression -> evaluate(env);
        ptr<Callable> callable = std::dynamic_pointer_cast<Callable>(value);

        if(!callable)
            throw ThrowPacket(ExceptionObjects::call_failed("Value not callable"));

        ValueList values;
        for(auto& expr : expressionList)
            values.push_back(expr -> evaluate(env));

        return callable->call(values);
    }